

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O1

VkDescriptorSet * __thiscall
vkt::pipeline::multisample::MSInstanceSampleMaskPattern::createMSPassDescSet
          (MSInstanceSampleMaskPattern *this,ImageMSParams *imageMSParams,
          VkDescriptorSetLayout *descSetLayout)

{
  VkDescriptorPool obj;
  deUint64 dVar1;
  DeviceInterface *pDVar2;
  Allocation *pAVar3;
  Move<vk::Handle<(vk::HandleType)22>_> *pMVar4;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DescriptorPoolBuilder *this_00;
  Buffer *this_01;
  DescriptorSetUpdateBuilder *this_02;
  VkDescriptorBufferInfo descBufferInfo;
  VkBufferCreateInfo bufferSampleMaskInfo;
  DescriptorSetUpdateBuilder local_88;
  Move<vk::Handle<(vk::HandleType)22>_> *local_38;
  
  vk = Context::getDeviceInterface
                 ((this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase
                  .super_TestInstance.m_context);
  device = Context::getDevice((this->super_MSInstanceBaseResolveAndPerSampleFetch).
                              super_MultisampleInstanceBase.super_TestInstance.m_context);
  allocator = Context::getDefaultAllocator
                        ((this->super_MSInstanceBaseResolveAndPerSampleFetch).
                         super_MultisampleInstanceBase.super_TestInstance.m_context);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&descBufferInfo);
  this_00 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&descBufferInfo,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1)
  ;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&bufferSampleMaskInfo,this_00,vk,device,1,1);
  local_88.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bufferSampleMaskInfo._16_8_;
  local_88.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)bufferSampleMaskInfo.size;
  local_88.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)bufferSampleMaskInfo._0_8_;
  local_88.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)bufferSampleMaskInfo.pNext;
  bufferSampleMaskInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferSampleMaskInfo._4_4_ = 0;
  bufferSampleMaskInfo.pNext = (void *)0x0;
  bufferSampleMaskInfo.flags = 0;
  bufferSampleMaskInfo._20_4_ = 0;
  bufferSampleMaskInfo.size = 0;
  obj.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj);
  }
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)
       local_88.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)
         local_88.m_writes.
         super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
         _M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       (deUint64)
       local_88.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_88.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (bufferSampleMaskInfo._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&bufferSampleMaskInfo.pNext,
               (VkDescriptorPool)bufferSampleMaskInfo._0_8_);
  }
  bufferSampleMaskInfo.flags = 0;
  bufferSampleMaskInfo._20_4_ = 0;
  bufferSampleMaskInfo.size = 0;
  bufferSampleMaskInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferSampleMaskInfo._4_4_ = 0;
  bufferSampleMaskInfo.pNext = (void *)0x0;
  if (descBufferInfo.buffer.m_internal != 0) {
    operator_delete((void *)descBufferInfo.buffer.m_internal,
                    descBufferInfo.range - descBufferInfo.buffer.m_internal);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&bufferSampleMaskInfo,vk,device,
                    (VkDescriptorPool)
                    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                    object.m_internal,(VkDescriptorSetLayout)descSetLayout->m_internal);
  local_88.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = bufferSampleMaskInfo.flags;
  local_88.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = bufferSampleMaskInfo._20_4_;
  local_88.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)bufferSampleMaskInfo.size;
  local_88.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)bufferSampleMaskInfo._0_8_;
  local_88.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)bufferSampleMaskInfo.pNext;
  bufferSampleMaskInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferSampleMaskInfo._4_4_ = 0;
  bufferSampleMaskInfo.pNext = (void *)0x0;
  bufferSampleMaskInfo.flags = 0;
  bufferSampleMaskInfo._20_4_ = 0;
  bufferSampleMaskInfo.size = 0;
  dVar1 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
          m_internal;
  if (dVar1 != 0) {
    pDVar2 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface;
    descBufferInfo.buffer.m_internal = dVar1;
    (*pDVar2->_vptr_DeviceInterface[0x3d])
              (pDVar2,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                      deleter.m_device,
               (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_pool.m_internal,1);
  }
  *(VkBufferCreateFlags *)
   &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkBufferCreateFlags)
       local_88.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *(undefined4 *)
   ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
           m_device + 4) =
       local_88.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  *(undefined4 *)
   &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
    m_internal = local_88.m_writes.
                 super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_;
  *(undefined4 *)
   ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
           m_pool.m_internal + 4) =
       local_88.m_writes.
       super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
       _M_impl.super__Vector_impl_data._M_start._4_4_;
  *(VkStructureType *)
   &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
       = (VkStructureType)
         local_88.m_writeDescriptorInfos.
         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  *(undefined4 *)
   ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
           m_internal + 4) =
       local_88.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  *(undefined4 *)
   &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
    m_deviceIface =
       local_88.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  *(undefined4 *)
   ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
           m_deviceIface + 4) =
       local_88.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  if (bufferSampleMaskInfo._0_8_ != 0) {
    local_88.m_writeDescriptorInfos.
    super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)bufferSampleMaskInfo._0_8_;
    (**(code **)(*bufferSampleMaskInfo.pNext + 0x1e8))
              (bufferSampleMaskInfo.pNext,bufferSampleMaskInfo._16_8_,bufferSampleMaskInfo.size,1);
  }
  local_38 = &this->m_descriptorSet;
  makeBufferCreateInfo(&bufferSampleMaskInfo,4,0x10);
  this_01 = (Buffer *)operator_new(0x30);
  pipeline::Buffer::Buffer(this_01,vk,device,allocator,&bufferSampleMaskInfo,(MemoryRequirement)0x1)
  ;
  local_88.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if ((this->m_buffer).
      super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>.m_data.ptr
      != this_01) {
    de::details::UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>::
    reset(&(this->m_buffer).
           super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>);
    (this->m_buffer).
    super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>.m_data.ptr =
         this_01;
  }
  de::details::UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>::reset
            ((UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_> *)
             &local_88);
  *(undefined4 *)
   ((((this->m_buffer).
      super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>.m_data.ptr
     )->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
   ptr)->m_hostPtr =
       *(undefined4 *)
        &(this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase.
         field_0x2c;
  pAVar3 = (((this->m_buffer).
             super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>.
             m_data.ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar3->m_memory).m_internal,pAVar3->m_offset,
             0xffffffffffffffff);
  descBufferInfo.buffer.m_internal =
       (((this->m_buffer).
         super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>.m_data.
        ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  descBufferInfo.offset = 0;
  descBufferInfo.range = 4;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_88);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      (&local_88,
                       (int)(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                            m_data.object.m_internal,(void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  pMVar4 = local_38;
  if (local_88.m_copies.
      super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.m_copies.
                    super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.m_copies.
                          super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.m_copies.
                          super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.m_writes.
      super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.m_writes.
                    super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.m_writes.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.m_writes.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector(&local_88.m_writeDescriptorInfos);
  return (VkDescriptorSet *)pMVar4;
}

Assistant:

const VkDescriptorSet* MSInstanceSampleMaskPattern::createMSPassDescSet (const ImageMSParams& imageMSParams, const VkDescriptorSetLayout* descSetLayout)
{
	DE_UNREF(imageMSParams);

	const DeviceInterface&		deviceInterface = m_context.getDeviceInterface();
	const VkDevice				device			= m_context.getDevice();
	Allocator&					allocator		= m_context.getDefaultAllocator();

	// Create descriptor pool
	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, 1u)
		.build(deviceInterface, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

	// Create descriptor set
	m_descriptorSet = makeDescriptorSet(deviceInterface, device, *m_descriptorPool, *descSetLayout);

	const VkBufferCreateInfo bufferSampleMaskInfo = makeBufferCreateInfo(sizeof(VkSampleMask), VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);

	m_buffer = de::MovePtr<Buffer>(new Buffer(deviceInterface, device, allocator, bufferSampleMaskInfo, MemoryRequirement::HostVisible));

	deMemcpy(m_buffer->getAllocation().getHostPtr(), &m_sampleMask, sizeof(VkSampleMask));

	flushMappedMemoryRange(deviceInterface, device, m_buffer->getAllocation().getMemory(), m_buffer->getAllocation().getOffset(), VK_WHOLE_SIZE);

	const VkDescriptorBufferInfo descBufferInfo = makeDescriptorBufferInfo(**m_buffer, 0u, sizeof(VkSampleMask));

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descBufferInfo)
		.update(deviceInterface, device);

	return &m_descriptorSet.get();
}